

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_state_auth_resp(connectdata *conn,int pop3code,pop3state instate)

{
  saslprogress local_34;
  anon_union_240_10_26c073a1_for_proto *paStack_30;
  saslprogress progress;
  pop3_conn *pop3c;
  Curl_easy *data;
  pop3state local_18;
  CURLcode result;
  pop3state instate_local;
  int pop3code_local;
  connectdata *conn_local;
  
  data._4_4_ = 0;
  pop3c = (pop3_conn *)conn->data;
  paStack_30 = &conn->proto;
  local_18 = instate;
  result = pop3code;
  _instate_local = conn;
  data._4_4_ = Curl_sasl_continue((SASL *)&(conn->proto).imapc.sasl.prefmech,conn,pop3code,&local_34
                                 );
  if (data._4_4_ == CURLE_OK) {
    if (local_34 == SASL_IDLE) {
      if (((paStack_30->ftpc).prevmethod & (paStack_30->pop3c).preftype & FTPFILE_NOCWD) == 0) {
        if (((paStack_30->ftpc).prevmethod & (paStack_30->pop3c).preftype & FTPFILE_MULTICWD) == 0)
        {
          Curl_failf((Curl_easy *)pop3c,"Authentication cancelled");
          data._4_4_ = CURLE_LOGIN_DENIED;
        }
        else {
          data._4_4_ = pop3_perform_user(_instate_local);
        }
      }
      else {
        data._4_4_ = pop3_perform_apop(_instate_local);
      }
    }
    else if (local_34 == SASL_DONE) {
      state(_instate_local,POP3_STOP);
    }
  }
  return data._4_4_;
}

Assistant:

static CURLcode pop3_state_auth_resp(struct connectdata *conn,
                                     int pop3code,
                                     pop3state instate)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  saslprogress progress;

  (void)instate; /* no use for this yet */

  result = Curl_sasl_continue(&pop3c->sasl, conn, pop3code, &progress);
  if(!result)
    switch(progress) {
    case SASL_DONE:
      state(conn, POP3_STOP);  /* Authenticated */
      break;
    case SASL_IDLE:            /* No mechanism left after cancellation */
#ifndef CURL_DISABLE_CRYPTO_AUTH
      if(pop3c->authtypes & pop3c->preftype & POP3_TYPE_APOP)
        /* Perform APOP authentication */
        result = pop3_perform_apop(conn);
      else
#endif
      if(pop3c->authtypes & pop3c->preftype & POP3_TYPE_CLEARTEXT)
        /* Perform clear text authentication */
        result = pop3_perform_user(conn);
      else {
        failf(data, "Authentication cancelled");
        result = CURLE_LOGIN_DENIED;
      }
      break;
    default:
      break;
    }

  return result;
}